

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::updateWindowSize(GLEngine *this,bool force)

{
  undefined7 in_register_00000031;
  int newWindowHeight;
  int newBufferHeight;
  int newWindowWidth;
  int newBufferWidth;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  glfwGetFramebufferSize(this->mainWindow,&local_14,&local_1c);
  glfwGetWindowSize(this->mainWindow,&local_18,&local_20);
  if (((((int)CONCAT71(in_register_00000031,force) != 0) || (local_14 != view::bufferWidth)) ||
      (local_1c != view::bufferHeight)) ||
     ((local_20 != view::windowHeight || (local_18 != view::windowWidth)))) {
    requestRedraw();
    if (local_1c == 0) {
      local_1c = 1;
    }
    if (local_20 == 0) {
      local_20 = 1;
    }
    view::bufferWidth = local_14;
    view::bufferHeight = local_1c;
    view::windowWidth = local_18;
    view::windowHeight = local_20;
    (**(code **)(*render::engine + 0x38))();
    (**(code **)(*render::engine + 0x40))();
  }
  return;
}

Assistant:

void GLEngine::updateWindowSize(bool force) {
  int newBufferWidth, newBufferHeight, newWindowWidth, newWindowHeight;
  glfwGetFramebufferSize(mainWindow, &newBufferWidth, &newBufferHeight);
  glfwGetWindowSize(mainWindow, &newWindowWidth, &newWindowHeight);
  if (force || newBufferWidth != view::bufferWidth || newBufferHeight != view::bufferHeight ||
      newWindowHeight != view::windowHeight || newWindowWidth != view::windowWidth) {
    // Basically a resize callback
    requestRedraw();

    // prevent any division by zero for e.g. aspect ratio calcs
    if (newBufferHeight == 0) newBufferHeight = 1;
    if (newWindowHeight == 0) newWindowHeight = 1;

    view::bufferWidth = newBufferWidth;
    view::bufferHeight = newBufferHeight;
    view::windowWidth = newWindowWidth;
    view::windowHeight = newWindowHeight;

    render::engine->resizeScreenBuffers();
    render::engine->setScreenBufferViewports();
  }
}